

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script_object
          (LinkedObjectFile *this,int seg,int byte_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  LinkedWord *word;
  pointer pvVar1;
  long lVar2;
  pointer pLVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined1 auVar7 [8];
  undefined1 auVar8 [8];
  _Alloc_hider _Var9;
  char cVar10;
  char cVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  uint uVar16;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_00;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  shared_ptr<Form> sVar19;
  string debug;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  this_00 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  (this->stats).total_code_bytes = 0;
  (this->stats).total_v2_code_bytes = 0;
  (this->stats).total_v2_pointers = 0;
  _Var6 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar5 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->stats).total_v2_pointer_seeks = 0;
  uVar13 = (uint)seen;
  if (((ulong)seen & 3) != 0) {
    printf("align %d\n",(ulong)(uVar13 & 7));
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x328,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  }
  uVar17 = (ulong)byte_idx;
  pvVar1 = (this_00->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = ((long)(this_00->words_by_seg).
                  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
           -0x5555555555555555;
  if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
LAB_00131c3c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar16 = uVar13 + 3;
  if (-1 < (int)uVar13) {
    uVar16 = uVar13;
  }
  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)((int)uVar16 >> 2);
  lVar2 = *(long *)&pvVar1[uVar17].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                    _M_impl.super__Vector_impl_data;
  _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (((long)*(pointer *)
                          ((long)&pvVar1[uVar17].
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                 -0x5555555555555555);
  if (_Var15._M_pi < p_Var18 || (long)_Var15._M_pi - (long)p_Var18 == 0) goto LAB_00131c3c;
  word = (LinkedWord *)(lVar2 + (long)p_Var18 * 0x30);
  switch(*(undefined4 *)(lVar2 + (long)p_Var18 * 0x30)) {
  case 0:
    uVar13 = word->data;
    cVar11 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar10 = '\x04';
      do {
        cVar11 = cVar10;
        if (uVar16 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00131bb4;
        }
        if (uVar16 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00131bb4;
        }
        if (uVar16 < 10000) goto LAB_00131bb4;
        bVar12 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar10 = cVar11 + '\x04';
      } while (bVar12);
      cVar11 = cVar11 + '\x01';
    }
LAB_00131bb4:
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::_M_construct((ulong)local_68,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,(uint)p_Stack_60,uVar13);
    sVar19 = toForm((string *)&local_48);
    p_Var4 = p_Stack_40;
    _Var9._M_p = local_48._M_p;
    _Var15 = sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_48._M_p = (pointer)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers;
    *(pointer *)&this->stats = _Var9._M_p;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers = p_Var4;
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      _Var15._M_pi = extraout_RDX_03;
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      _Var15._M_pi = extraout_RDX_04;
    }
    if (local_68 == (undefined1  [8])&local_58) goto LAB_00131c2a;
LAB_00131c1d:
    operator_delete((void *)local_68,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
    _Var15._M_pi = extraout_RDX_05;
    goto LAB_00131c2a;
  case 1:
    uVar17 = (ulong)word->label_id;
    pLVar3 = (this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * -0x3333333333333333;
    if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    uVar13 = pLVar3[uVar17].offset;
    if ((uVar13 & 7) == 2) {
      uVar16 = uVar13 + 3;
      if (-1 < (int)uVar13) {
        uVar16 = uVar13;
      }
      sVar19 = to_form_script((LinkedObjectFile *)local_68,seg,byte_idx,
                              (vector<bool,_std::allocator<bool>_> *)(ulong)(uint)((int)uVar16 >> 2)
                             );
      _Var15 = sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      bVar12 = is_string(this_00,byte_idx,uVar13);
      if (bVar12) {
        uVar16 = uVar13 + 3;
        if (-1 < (int)uVar13) {
          uVar16 = uVar13;
        }
        get_goal_string_abi_cxx11_((string *)local_68,this_00,byte_idx,((int)uVar16 >> 2) + -1);
        sVar19 = toForm((string *)&local_48);
        p_Var4 = p_Stack_40;
        _Var9._M_p = local_48._M_p;
        _Var15 = sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_48._M_p = (pointer)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers
        ;
        *(pointer *)&this->stats = _Var9._M_p;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers = p_Var4;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          _Var15._M_pi = extraout_RDX;
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          _Var15._M_pi = extraout_RDX_00;
        }
        if (local_68 == (undefined1  [8])&local_58) goto LAB_00131c2a;
        goto LAB_00131c1d;
      }
      uVar14 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar14 < (ulong)(long)word->label_id || uVar14 - (long)word->label_id == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      sVar19 = toForm((string *)local_68);
      _Var15 = sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    break;
  default:
    local_68 = (undefined1  [8])&local_58;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_local_buf[0] = '\0';
    append_word_to_string(this_00,(string *)local_68,word);
    printf("don\'t know how to print %s\n",local_68);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,800,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  case 4:
    sVar19 = toForm((string *)local_68);
    _Var15 = sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 5:
    if (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    *(element_type **)&this->stats = peVar5;
    p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers = _Var6._M_pi
    ;
    goto LAB_00131b9d;
  }
  p_Var18 = p_Stack_60;
  auVar7 = local_68;
  local_68 = (undefined1  [8])0x0;
  auVar8 = local_68;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers;
  local_68._0_4_ = auVar7._0_4_;
  local_68._4_4_ = auVar7._4_4_;
  (this->stats).total_code_bytes = local_68._0_4_;
  (this->stats).total_v2_code_bytes = local_68._4_4_;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers = p_Var18;
  p_Var18 = p_Stack_60;
  local_68 = auVar8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    _Var15._M_pi = extraout_RDX_01;
    p_Var18 = p_Stack_60;
  }
LAB_00131b9d:
  if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
    _Var15._M_pi = extraout_RDX_02;
  }
LAB_00131c2a:
  sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var15._M_pi;
  sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Form>)sVar19.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int seg,
                                                              int byte_idx,
                                                              std::vector<bool>& seen) {
  std::shared_ptr<Form> result;

  switch (byte_idx & 7) {
    case 0:
    case 4: {
      auto& word = words_by_seg.at(seg).at(byte_idx / 4);
      if (word.kind == LinkedWord::SYM_PTR) {
        // .symbol xxxx
        result = toForm(word.symbol_name);
      } else if (word.kind == LinkedWord::PLAIN_DATA) {
        // .word xxxxx
        result = toForm(std::to_string(word.data));
      } else if (word.kind == LinkedWord::PTR) {
        // might be a sub-list, or some other random pointer
        auto offset = labels.at(word.label_id).offset;
        if ((offset & 7) == 2) {
          // list!
          result = to_form_script(seg, offset / 4, seen);
        } else {
          if (is_string(seg, offset)) {
            result = toForm(get_goal_string(seg, offset / 4 - 1));
          } else {
            // some random pointer, just print the label.
            result = toForm(labels.at(word.label_id).name);
          }
        }
      } else if (word.kind == LinkedWord::EMPTY_PTR) {
        result = gSymbolTable.getEmptyPair();
      } else {
        std::string debug;
        append_word_to_string(debug, word);
        printf("don't know how to print %s\n", debug.c_str());
        assert(false);
      }
    } break;

    case 2:  // bad, a pair snuck through.
    default:
      // pointers should be aligned!
      printf("align %d\n", byte_idx & 7);
      assert(false);
  }

  return result;
}